

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

void __thiscall Assimp::XGLImporter::ReadLighting(XGLImporter *this,TempScope *scope)

{
  bool bVar1;
  aiLight *paVar2;
  string local_50;
  
  do {
    bVar1 = ReadElementUpToClosing(this,"lighting");
    if (!bVar1) {
      return;
    }
    GetElementName_abi_cxx11_(&local_50,this);
    bVar1 = std::operator==(&local_50,"directionallight");
    if (bVar1) {
      paVar2 = ReadDirectionalLight(this);
      scope->light = paVar2;
    }
    else {
      bVar1 = std::operator==(&local_50,"ambient");
      if (!bVar1) {
        bVar1 = std::operator==(&local_50,"spheremap");
        if (!bVar1) goto LAB_004fe9ad;
      }
      LogFunctions<Assimp::XGLImporter>::LogWarn((char *)0x4fe9ad);
    }
LAB_004fe9ad:
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

void XGLImporter::ReadLighting(TempScope& scope)
{
    while (ReadElementUpToClosing("lighting"))  {
        const std::string& s = GetElementName();
        if (s == "directionallight") {
            scope.light = ReadDirectionalLight();
        }
        else if (s == "ambient") {
            LogWarn("ignoring <ambient> tag");
        }
        else if (s == "spheremap") {
            LogWarn("ignoring <spheremap> tag");
        }
    }
}